

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O0

void __thiscall KktChStep::resizeProblemMatrix(KktChStep *this,KktCheck *checker)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  undefined4 *in_RDI;
  int iPut;
  int iCol;
  int iRow;
  int k_1;
  vector<int,_std::allocator<int>_> iwork;
  int numColEq;
  int numRowEq;
  vector<int,_std::allocator<int>_> cIndex;
  vector<int,_std::allocator<int>_> rIndex;
  vector<int,_std::allocator<int>_> nzRow;
  int nC;
  int nR;
  int nz;
  int k;
  int j;
  int i;
  allocator_type *in_stack_fffffffffffffe88;
  value_type vVar4;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe90;
  value_type in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  value_type in_stack_fffffffffffffea4;
  size_type in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  undefined4 in_stack_fffffffffffffeb8;
  value_type vVar5;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  int local_c8;
  vector<int,_std::allocator<int>_> local_b8;
  int local_a0;
  int local_9c;
  undefined4 local_94;
  vector<int,_std::allocator<int>_> local_90;
  undefined4 local_74;
  vector<int,_std::allocator<int>_> local_70;
  undefined4 local_44;
  vector<int,_std::allocator<int>_> local_40;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  local_20 = 0;
  local_24 = 0;
  local_28 = 0;
  local_44 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1c2c14);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98,(value_type *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::allocator<int>::~allocator((allocator<int> *)0x1c2c48);
  for (local_14 = 0; local_14 < (int)in_RDI[1]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
      for (local_1c = *pvVar2; iVar1 = local_1c,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(local_14 + 1)
                             ), iVar1 < *pvVar2; local_1c = local_1c + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_1c);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)*pvVar2);
        if (*pvVar2 != 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_14);
          *pvVar2 = *pvVar2 + 1;
        }
      }
    }
  }
  in_RDI[0x3f] = in_RDI[1];
  in_RDI[0x3e] = *in_RDI;
  local_74 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x1c2dea);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98,(value_type *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::allocator<int>::~allocator((allocator<int> *)0x1c2e1b);
  local_94 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x1c2e4c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98,(value_type *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::allocator<int>::~allocator((allocator<int> *)0x1c2e7a);
  for (local_14 = 0; local_14 < (int)in_RDI[0x3f]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_40,(long)local_14);
      iVar1 = local_24;
      local_20 = *pvVar2 + local_20;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_14);
      *pvVar2 = iVar1;
      local_24 = local_24 + 1;
    }
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x3e]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)local_14);
    iVar1 = local_28;
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_14);
      *pvVar2 = iVar1;
      local_28 = local_28 + 1;
    }
  }
  KktCheck::setIndexVectors
            ((KktCheck *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
             (vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  local_9c = in_RDI[0x3f];
  local_a0 = in_RDI[0x3e];
  in_RDI[0x3f] = local_24;
  in_RDI[0x3e] = local_28;
  std::allocator<int>::allocator((allocator<int> *)0x1c309d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98,(value_type *)in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88);
  std::allocator<int>::~allocator((allocator<int> *)0x1c30cb);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
             ,(value_type *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  for (local_14 = 0; local_14 < local_9c; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
      local_c8 = *pvVar2;
      while (iVar1 = local_c8,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                (long)(local_14 + 1)), iVar1 < *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_c8);
        local_18 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)local_18);
        if (*pvVar2 != 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_18);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)*pvVar2);
          *pvVar2 = *pvVar2 + 1;
        }
        local_c8 = local_c8 + 1;
      }
    }
  }
  for (local_14 = 1; local_14 <= (int)in_RDI[0x3e]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)(local_14 + -1));
    vVar5 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)(local_14 + -1));
    iVar1 = vVar5 + *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_14);
    *pvVar2 = iVar1;
  }
  for (local_14 = 0; local_14 < (int)in_RDI[0x3e]; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_14);
    vVar5 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)local_14);
    *pvVar2 = vVar5;
  }
  for (local_14 = 0; local_14 < local_9c; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_70,(long)local_14);
      vVar5 = *pvVar2;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_14);
      local_1c = *pvVar2;
      while (iVar1 = local_1c,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                (long)(local_14 + 1)), iVar1 < *pvVar2) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_1c);
        local_18 = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)local_18);
        if (*pvVar2 != 0) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_90,(long)local_18);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_b8,(long)*pvVar2);
          iVar1 = *pvVar2;
          *pvVar2 = iVar1 + 1;
          in_stack_fffffffffffffea4 = vVar5;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x46),(long)iVar1);
          *pvVar2 = in_stack_fffffffffffffea4;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                              (long)local_1c);
          vVar4 = *pvVar3;
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x4c),(long)iVar1
                             );
          *pvVar3 = vVar4;
        }
        local_1c = local_1c + 1;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  local_1c = 0;
  for (local_14 = 0; local_14 < local_a0; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x32),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x14),(long)local_14)
      ;
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x52),(long)local_1c)
      ;
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a),(long)local_14)
      ;
      in_stack_fffffffffffffe90 = (vector<int,_std::allocator<int>_> *)*pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x58),(long)local_1c)
      ;
      *pvVar3 = (value_type)in_stack_fffffffffffffe90;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)local_14)
      ;
      in_stack_fffffffffffffe98 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x5e),(long)local_1c)
      ;
      *pvVar3 = in_stack_fffffffffffffe98;
      local_1c = local_1c + 1;
    }
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (size_type)in_stack_fffffffffffffe98);
  local_1c = 0;
  for (local_14 = 0; local_14 < local_9c; local_14 = local_14 + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    if (*pvVar2 != 0) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2c),(long)local_14)
      ;
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6a),(long)local_1c)
      ;
      *pvVar3 = vVar4;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x26),(long)local_14)
      ;
      vVar4 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 100),(long)local_1c);
      *pvVar3 = vVar4;
      local_1c = local_1c + 1;
    }
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe90);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe90);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe90);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffe90);
  return;
}

Assistant:

void KktChStep::resizeProblemMatrix(KktCheck& checker) {
	//full matrix data in AR copy, A copy made to be passed to checker
	int i, j, k;
	int nz = 0;
	int nR = 0;
	int nC = 0;
	
	//nzRow is the current # on nonzeros, not the general one! 
	vector<int> nzRow(RnumRow, 0);
	for (i=0;i<RnumRow;i++) 
		if (flagRow[i])
			for (k=ARstart[i]; k<ARstart[i+1]; k++) 
				if (flagCol[ARindex[k]]) 
					nzRow[i]++;
	
	numRow = RnumRow;
	numCol = RnumCol;
	//arrays to keep track of indices
	vector<int> rIndex(numRow, -1);
	vector<int> cIndex(numCol, -1);
		 
	for (i=0;i<numRow;i++)
		if (flagRow[i]) {
			nz += nzRow[i];
			rIndex[i] = nR;
			nR++;
			}
			
	for (i=0;i<numCol;i++)
		if (flagCol[i]) {
			cIndex[i] = nC;
			nC++;
		}

	//set indices for checker
	checker.setIndexVectors(rIndex, cIndex);
		
	//counts		
	int numRowEq = numRow;
	int numColEq = numCol;
	numRow = nR;
	numCol = nC;
	
	//matrix
    vector<int> iwork(numCol, 0);
    Astart.resize(numCol + 1, 0);
    Aindex.resize(nz);
    Avalue.resize(nz);
    
        
    for (i = 0;i<numRowEq; i++) 
    	if (flagRow[i])
    	    for (int k = ARstart[i]; k < ARstart[i+1]; k++) {
    	    	j = ARindex[k];
    	    	if (flagCol[j])
        			iwork[cIndex[j]]++;
        		}     
    for (i = 1; i <= numCol; i++)
        Astart[i] = Astart[i - 1] + iwork[i - 1];
    for (i = 0; i < numCol; i++)
        iwork[i] = Astart[i];
    for (i = 0; i < numRowEq; i++) {
    	if (flagRow[i]) {
			int iRow = rIndex[i];
		    for (k = ARstart[i]; k < ARstart[i + 1]; k++) {
		        j = ARindex[k];
		        if (flagCol[j]) {
		        	int iCol = cIndex[j];
				    int iPut = iwork[iCol]++;
				    Aindex[iPut] = iRow;
				    Avalue[iPut] = ARvalue[k];
				}
		    }
		}
    }
	
	//resize cost, RHS, bounds    
    colCost.resize(numCol);
    colLower.resize(numCol);
    colUpper.resize(numCol);
    
    k=0;
    for (i=0;i<numColEq;i++) 
    	if (flagCol[i]) {
    		colCost[k]  = RcolCost[i];
    		colLower[k] = RcolLower[i];
    		colUpper[k] = RcolUpper[i];
    		k++;
	    }
    
    rowLower.resize(numRow);
    rowUpper.resize(numRow);

    k=0;
    for (i=0;i<numRowEq;i++) 
    	if (flagRow[i]) {
    		rowUpper[k] = RrowUpper[i];
    		rowLower[k] = RrowLower[i];

    		//b[k] = Rb[i];
    		k++;
	    }
	
	
		
}